

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

QPlatformMenuItem * __thiscall
QMenuPrivate::insertActionInPlatformMenu
          (QMenuPrivate *this,QAction *action,QPlatformMenuItem *beforeItem)

{
  QPlatformMenu *pQVar1;
  ContextType *context;
  Object *in_RDX;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  QPlatformMenuItem *menuItem;
  offset_in_QAction_to_subr *slot;
  offset_in_QPlatformMenuItem_to_subr in_stack_ffffffffffffffd0;
  Connection local_28;
  code *local_20;
  QPlatformMenuItem *item;
  ConnectionType in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  QMenuPrivate *this_00;
  
  this_00 = *(QMenuPrivate **)(in_FS_OFFSET + 0x28);
  pQVar1 = QPointer<QPlatformMenu>::operator->((QPointer<QPlatformMenu> *)0x63ecf6);
  context = (ContextType *)(**(code **)(*(long *)pQVar1 + 0xf0))();
  (**(code **)(*(long *)context + 0x60))(context,in_RSI);
  local_20 = QAction::trigger;
  item = (QPlatformMenuItem *)0x0;
  slot = (offset_in_QAction_to_subr *)0x0;
  QObject::connect<void(QPlatformMenuItem::*)(),void(QAction::*)()>
            (in_RDX,in_stack_ffffffffffffffd0,context,(offset_in_QAction_to_subr *)0x0,
             in_stack_fffffffffffffff0);
  QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffff0);
  QObject::connect<void(QPlatformMenuItem::*)(),void(QAction::*)()>
            (in_RDX,0,context,slot,in_stack_fffffffffffffff0);
  QMetaObject::Connection::~Connection(&local_28);
  copyActionToPlatformItem
            (this_00,(QAction *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),item);
  pQVar1 = QPointer<QPlatformMenu>::operator->((QPointer<QPlatformMenu> *)0x63ee14);
  (**(code **)(*(long *)pQVar1 + 0x60))(pQVar1,context,in_RDX);
  if (*(QMenuPrivate **)(in_FS_OFFSET + 0x28) == this_00) {
    return (QPlatformMenuItem *)context;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformMenuItem * QMenuPrivate::insertActionInPlatformMenu(const QAction *action, QPlatformMenuItem *beforeItem)
{
    QPlatformMenuItem *menuItem = platformMenu->createMenuItem();
    Q_ASSERT(menuItem);

    menuItem->setTag(reinterpret_cast<quintptr>(action));
    QObject::connect(menuItem, &QPlatformMenuItem::activated, action, &QAction::trigger, Qt::QueuedConnection);
    QObject::connect(menuItem, &QPlatformMenuItem::hovered, action, &QAction::hovered, Qt::QueuedConnection);
    copyActionToPlatformItem(action, menuItem);
    platformMenu->insertMenuItem(menuItem, beforeItem);

    return menuItem;
}